

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_ops_n_half_by_n_half(void)

{
  bool bVar1;
  local_uintwide_t_small_unsigned_type *v;
  uint_fast8_t in_CL;
  undefined7 in_register_00000009;
  bool local_57c;
  bool local_57b;
  bool local_57a;
  bool local_579;
  enable_if_t<std::is_integral<int>::value,_bool> local_578;
  bool local_577;
  bool local_576;
  bool local_575;
  enable_if_t<std::is_integral<int>::value,_bool> local_574;
  bool local_573;
  bool local_572;
  undefined1 local_570 [7];
  bool result_convert_is_ok;
  local_uintwide_t_half_signed_type x_ctrl_signed;
  local_uintwide_t_small_unsigned_type x_small_unsigned;
  uintwide_t<128U,_unsigned_short,_void,_true> x_half_signed;
  uint_fast8_t i_8;
  undefined1 local_50c [7];
  bool result_gcd_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> local_4ec;
  undefined1 local_4cc [8];
  uintwide_t<256U,_unsigned_short,_void,_false> gcd_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> gcd_half;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half_2;
  uintwide_t<128U,_unsigned_short,_void,_false> left_half_2;
  uint i_7;
  undefined1 local_454 [7];
  bool result_xor_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> local_434;
  undefined1 local_414 [8];
  uintwide_t<256U,_unsigned_short,_void,_false> xor_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> xor_half;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half_1;
  uintwide_t<128U,_unsigned_short,_void,_false> left_half_1;
  uint i_6;
  undefined1 local_399;
  undefined1 local_398 [7];
  bool result_shr_is_ok_1;
  undefined1 local_378 [8];
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  shr_ctrl_1;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<128U,_unsigned_short,_void,_false>_>
  shr_half_1;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half_3;
  int i_5;
  undefined1 local_310 [7];
  bool result_shr_is_ok;
  undefined1 local_2f0 [8];
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> shr_ctrl
  ;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<128U,_unsigned_short,_void,_false>_> shr_half
  ;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half_2;
  int i_4;
  undefined1 local_28a [7];
  bool result_rootk_is_ok;
  undefined1 local_26a [8];
  uintwide_t<256U,_unsigned_short,_void,_false> rootk_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> rootk_half;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half_1;
  undefined1 local_222;
  uint_fast8_t i_3;
  undefined1 local_201;
  undefined1 local_200 [7];
  bool result_pow_zero_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> local_1e0;
  undefined1 local_1c0 [8];
  uintwide_t<256U,_unsigned_short,_void,_false> pow_zero_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> pow_zero_half;
  representation_type local_180;
  undefined1 local_170 [8];
  uintwide_t<128U,_unsigned_short,_void,_false> zero_half;
  uintwide_t<128U,_unsigned_short,_void,_false> arg_half;
  uint i_2;
  undefined1 local_128 [7];
  bool result_pow_is_ok;
  undefined1 local_108 [8];
  uintwide_t<256U,_unsigned_short,_void,_false> pow_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> pow_half;
  uintwide_t<128U,_unsigned_short,_void,_false> x_half;
  uint i_1;
  undefined1 local_a0 [7];
  bool result_multiply_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> local_80;
  undefined1 local_60 [8];
  uintwide_t<256U,_unsigned_short,_void,_false> prod_ctrl;
  uintwide_t<128U,_unsigned_short,_void,_false> prod_half;
  uintwide_t<128U,_unsigned_short,_void,_false> right_half;
  uintwide_t<128U,_unsigned_short,_void,_false> left_half;
  uint i;
  bool result_is_ok;
  
  left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = true;
  left_half.values.super_array<unsigned_short,_8UL>.elems[4] = 0;
  left_half.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (uint)left_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 0x18;
      left_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           left_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,hex,0xf);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,hex,0xf);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::operator*
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (right_half.values.super_array<unsigned_short,_8UL>.elems + 4),
                    (uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (prod_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              (&local_80,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (right_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_a0,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (prod_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::operator*
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_60,&local_80,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)local_a0);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_half.values.super_array<unsigned_short,_8UL>.elems + 7),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (prod_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (x_half.values.super_array<unsigned_short,_8UL>.elems + 7),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_60);
    local_572 = false;
    if (bVar1) {
      local_572 = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_572;
  }
  x_half.values.super_array<unsigned_short,_8UL>.elems[4] = 2;
  x_half.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (uint)x_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 8;
      x_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           x_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,hex,4);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::pow<unsigned_int,128u,unsigned_short,void,false>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (pow_half.values.super_array<unsigned_short,_8UL>.elems + 4),
                    (uint *)(x_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_128,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (pow_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::pow<unsigned_int,256u,unsigned_short,void,false>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_108,(wide_integer *)local_128,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_half.values.super_array<unsigned_short,_8UL>.elems + 4),
               (uint *)CONCAT71(in_register_00000009,in_CL));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (arg_half.values.super_array<unsigned_short,_8UL>.elems + 7),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (pow_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (arg_half.values.super_array<unsigned_short,_8UL>.elems + 7),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_108);
    local_573 = false;
    if (bVar1) {
      local_573 = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_573;
  }
  arg_half.values.super_array<unsigned_short,_8UL>.elems[4] = 0;
  arg_half.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (uint)arg_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 8;
      arg_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           arg_half.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    local_180.super_array<unsigned_short,_8UL>.elems =
         (array<unsigned_short,_8UL>)
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    v = zero_as_small_unsigned_type();
    math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_false>::
    uintwide_t<256U,_false,_nullptr>
              ((uintwide_t<128U,_unsigned_short,_void,_false> *)
               (pow_zero_half.values.super_array<unsigned_short,_8UL>.elems + 4),v);
    _local_170 = (value_type_conflict3  [8])
                 math::wide_integer::operator*
                           ((uintwide_t<128U,_unsigned_short,_void,_false> *)&local_180,
                            (uintwide_t<128U,_unsigned_short,_void,_false> *)
                            (pow_zero_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::
         pow<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>,128u,unsigned_short,void,false>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (zero_half.values.super_array<unsigned_short,_8UL>.elems + 4),
                    (uintwide_t<128U,_unsigned_short,_void,_false> *)local_170);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              (&local_1e0,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (zero_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_200,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)local_170);
    math::wide_integer::
    pow<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>,256u,unsigned_short,void,false>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_1c0,(wide_integer *)&local_1e0
               ,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_200,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)CONCAT71(in_register_00000009,in_CL)
              );
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_222,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (pow_zero_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    in_CL = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_222,
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_1c0);
    local_574 = false;
    if ((bool)in_CL) {
      x_half_1.values.super_array<unsigned_short,_8UL>.elems[5] = 1;
      x_half_1.values.super_array<unsigned_short,_8UL>.elems[6] = 0;
      local_574 = math::wide_integer::operator==
                            ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                             (pow_zero_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                             (int *)(x_half_1.values.super_array<unsigned_short,_8UL>.elems + 5));
    }
    local_201 = local_574;
    local_575 = false;
    if (local_574 != false) {
      local_575 = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_575;
  }
  for (x_half_1.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ = 3;
      x_half_1.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ < 0xe;
      x_half_1.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ =
           x_half_1.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::rootk<128u,unsigned_short,void,false>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (rootk_half.values.super_array<unsigned_short,_8UL>.elems + 4),
                    x_half_1.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_28a,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (rootk_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::rootk<256u,unsigned_short,void,false>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_26a,(wide_integer *)local_28a,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (ulong)x_half_1.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_,in_CL);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_half_2.values.super_array<unsigned_short,_8UL>.elems + 6),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (rootk_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (x_half_2.values.super_array<unsigned_short,_8UL>.elems + 6),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_26a);
    local_576 = false;
    if (bVar1) {
      local_576 = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_576;
  }
  x_half_2.values.super_array<unsigned_short,_8UL>.elems[4] = 2;
  x_half_2.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (int)x_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 0x28;
      x_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           x_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::operator>>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (shr_half.values.super_array<unsigned_short,_8UL>.elems + 4),
                    x_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_310,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (shr_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::operator>>
              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)local_2f0,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_310,
               x_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_half_3.values.super_array<unsigned_short,_8UL>.elems + 7),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (shr_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (x_half_3.values.super_array<unsigned_short,_8UL>.elems + 7),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_2f0);
    local_577 = false;
    if (bVar1) {
      local_577 = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_577;
  }
  x_half_3.values.super_array<unsigned_short,_8UL>.elems[4] = 0x3ea;
  x_half_3.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (int)x_half_3.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 0x3f4;
      x_half_3.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           x_half_3.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::operator>>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (shr_half_1.values.super_array<unsigned_short,_8UL>.elems + 4),
                    x_half_3.values.super_array<unsigned_short,_8UL>.elems._8_4_);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_398,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (shr_half_1.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::operator>>
              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)local_378,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_398,
               x_half_3.values.super_array<unsigned_short,_8UL>.elems._8_4_);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&i_6 + 2),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (shr_ctrl_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    in_CL = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&i_6 + 2),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_378);
    local_578 = false;
    if ((bool)in_CL) {
      left_half_1.values.super_array<unsigned_short,_8UL>.elems[6] = 0;
      left_half_1.values.super_array<unsigned_short,_8UL>.elems[7] = 0;
      local_578 = math::wide_integer::operator==
                            ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                             (shr_ctrl_1.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                             (int *)(left_half_1.values.super_array<unsigned_short,_8UL>.elems + 6))
      ;
    }
    local_399 = local_578;
    local_579 = false;
    if (local_578 != false) {
      local_579 = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_579;
  }
  left_half_1.values.super_array<unsigned_short,_8UL>.elems[4] = 0;
  left_half_1.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (uint)left_half_1.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 0x18;
      left_half_1.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           left_half_1.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::operator^
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (right_half_1.values.super_array<unsigned_short,_8UL>.elems + 4),
                    (uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (xor_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              (&local_434,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (right_half_1.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_454,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (xor_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::operator^
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_414,&local_434,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)local_454);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (left_half_2.values.super_array<unsigned_short,_8UL>.elems + 7),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (xor_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (left_half_2.values.super_array<unsigned_short,_8UL>.elems + 7),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_414);
    local_57a = false;
    if (bVar1) {
      local_57a = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_57a;
  }
  left_half_2.values.super_array<unsigned_short,_8UL>.elems[4] = 0;
  left_half_2.values.super_array<unsigned_short,_8UL>.elems[5] = 0;
  for (; (uint)left_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_ < 0x20;
      left_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_ =
           left_half_2.values.super_array<unsigned_short,_8UL>.elems._8_4_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,false>>
                   (true,dec,0x26);
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         math::wide_integer::gcd<128u,unsigned_short,void,false>
                   ((uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (right_half_2.values.super_array<unsigned_short,_8UL>.elems + 4),
                    (uintwide_t<128U,_unsigned_short,_void,_false> *)
                    (gcd_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              (&local_4ec,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (right_half_2.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_50c,
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (gcd_half.values.super_array<unsigned_short,_8UL>.elems + 4));
    math::wide_integer::gcd<256u,unsigned_short,void,false>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_4cc,(wide_integer *)&local_4ec
               ,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_50c,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)CONCAT71(in_register_00000009,in_CL)
              );
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_half_signed.values.super_array<unsigned_short,_8UL>.elems + 5),
               (uintwide_t<128U,_unsigned_short,_void,_false> *)
               (gcd_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (x_half_signed.values.super_array<unsigned_short,_8UL>.elems + 5),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)local_4cc);
    local_57b = false;
    if (bVar1) {
      local_57b = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_57b;
  }
  for (x_half_signed.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ = 0;
      x_half_signed.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ < 0x20;
      x_half_signed.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ =
           x_half_signed.values.super_array<unsigned_short,_8UL>.elems[4]._1_1_ + 1) {
    join_0x00000010_0x00000000_ =
         (value_type_conflict3  [8])
         generate_wide_integer_value<math::wide_integer::uintwide_t<128u,unsigned_short,void,true>>
                   (false,dec,0x1f);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<128U,_true,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_ctrl_signed.values.super_array<unsigned_short,_8UL>.elems + 4),
               (uintwide_t<128U,_unsigned_short,_void,_true> *)
               (x_small_unsigned.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_true>::
    uintwide_t<256U,_false,_nullptr>
              ((uintwide_t<128U,_unsigned_short,_void,_true> *)local_570,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (x_ctrl_signed.values.super_array<unsigned_short,_8UL>.elems + 4));
    bVar1 = math::wide_integer::uintwide_t<128U,_unsigned_short,_void,_true>::operator==
                      ((uintwide_t<128U,_unsigned_short,_void,_true> *)
                       (x_small_unsigned.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                       (uintwide_t<128U,_unsigned_short,_void,_true> *)local_570);
    local_57c = false;
    if (bVar1) {
      local_57c = left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
    }
    left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_ = local_57c;
  }
  return left_half.values.super_array<unsigned_short,_8UL>.elems[7]._1_1_;
}

Assistant:

auto test_ops_n_half_by_n_half() -> bool
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto right_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>
        (
            static_cast<int>(std::numeric_limits<local_uintwide_t_half_unsigned_type>::digits / 8)
          - static_cast<int>(INT8_C(1))
        )
      );

    const auto prod_half = left_half * right_half;
    const auto prod_ctrl =   local_uintwide_t_small_unsigned_type(left_half)
                           * local_uintwide_t_small_unsigned_type(right_half);


    const auto result_multiply_is_ok = (local_uintwide_t_small_unsigned_type(prod_half) == prod_ctrl);

    result_is_ok = (result_multiply_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(2));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>
      (
        true,
        local_base::hex,
        static_cast<int>(INT8_C(4))
      );

    const auto pow_half = pow(x_half, i);

    const auto pow_ctrl = pow(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_pow_is_ok = (local_uintwide_t_small_unsigned_type(pow_half) == pow_ctrl);

    result_is_ok = (result_pow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(8));
           ++i)
  {
    const auto arg_half  =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto zero_half =   generate_wide_integer_value<local_uintwide_t_half_unsigned_type>()
                           * local_uintwide_t_half_unsigned_type(zero_as_small_unsigned_type());

    const auto pow_zero_half = pow(arg_half, zero_half);

    const auto pow_zero_ctrl = pow(local_uintwide_t_small_unsigned_type(arg_half), local_uintwide_t_small_unsigned_type(zero_half));

    const auto result_pow_zero_is_ok = ((local_uintwide_t_small_unsigned_type(pow_zero_half) == pow_zero_ctrl) && (pow_zero_half == 1));

    result_is_ok = (result_pow_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(3));
             i < static_cast<std::uint_fast8_t>(UINT8_C(14));
           ++i)
  {
    const auto x_half =
      generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto rootk_half = rootk(x_half, i);

    const auto rootk_ctrl = rootk(local_uintwide_t_small_unsigned_type(x_half), i);

    const auto result_rootk_is_ok = (local_uintwide_t_small_unsigned_type(rootk_half) == rootk_ctrl);

    result_is_ok = (result_rootk_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT8_C(2));
             i < static_cast<signed>(INT8_C(40));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = (local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl);

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<signed>(INT16_C(1002));
             i < static_cast<signed>(INT16_C(1012));
           ++i)
  {
    const auto x_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto shr_half = x_half >> i;

    const auto shr_ctrl = local_uintwide_t_small_unsigned_type(x_half) >> i;

    const auto result_shr_is_ok = ((local_uintwide_t_small_unsigned_type(shr_half) == shr_ctrl) && (shr_half == 0));

    result_is_ok = (result_shr_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(24));
           ++i)
  {
    const auto left_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto xor_half = left_half ^ right_half;
    const auto xor_ctrl = (  local_uintwide_t_small_unsigned_type(left_half)
                           ^ local_uintwide_t_small_unsigned_type(right_half));


    const auto result_xor_is_ok = (local_uintwide_t_small_unsigned_type(xor_half) == xor_ctrl);

    result_is_ok = (result_xor_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(32));
           ++i)
  {
    const auto left_half  = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();
    const auto right_half = generate_wide_integer_value<local_uintwide_t_half_unsigned_type>();

    const auto gcd_half = gcd(left_half, right_half);
    const auto gcd_ctrl = gcd(local_uintwide_t_small_unsigned_type(left_half), local_uintwide_t_small_unsigned_type(right_half));

    const auto result_gcd_is_ok = (local_uintwide_t_small_unsigned_type(gcd_half) == gcd_ctrl);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<std::uint_fast8_t>(UINT8_C(0));
             i < static_cast<std::uint_fast8_t>(UINT8_C(32));
           ++i)
  {
    const auto x_half_signed =
      generate_wide_integer_value<local_uintwide_t_half_signed_type>
      (
        false,
        local_base::dec,
        static_cast<int>(std::numeric_limits<local_uintwide_t_half_signed_type>::digits10 - 7)
      );

    const auto x_small_unsigned = local_uintwide_t_small_unsigned_type(x_half_signed);
    const auto x_ctrl_signed    = static_cast<local_uintwide_t_half_signed_type>(x_small_unsigned);

    const auto result_convert_is_ok = (x_half_signed == x_ctrl_signed);

    result_is_ok = (result_convert_is_ok && result_is_ok);
  }

  return result_is_ok;
}